

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chizu.c
# Opt level: O0

czrect chizu_internal_lease_or_enlarge(chizu *atlas,uint width,uint height,void *data)

{
  uint uVar1;
  czmap *dst;
  czmap *newmap;
  uint uStack_40;
  uint inc;
  czrect resultrect;
  void *data_local;
  uint height_local;
  uint width_local;
  chizu *atlas_local;
  
  _atlas_local = czmap_lease(atlas->map,width,height,data);
  uStack_40 = (uint)atlas_local;
  if ((((uStack_40 == 0) && (inc = atlas_local._4_4_, inc == 0)) &&
      (resultrect.x = atlas_local._8_4_, resultrect.x == 0)) &&
     (resultrect.y = atlas_local._12_4_, resultrect.y == 0)) {
    newmap._4_4_ = width;
    if (width < height) {
      newmap._4_4_ = height;
    }
    if ((atlas->size).h < (atlas->size).w) {
      (atlas->size).h = newmap._4_4_ + (atlas->size).h;
    }
    else {
      (atlas->size).w = newmap._4_4_ + (atlas->size).w;
    }
    uVar1 = chizu_internal_next_power_of_2((atlas->size).w);
    (atlas->size).w = uVar1;
    uVar1 = chizu_internal_next_power_of_2((atlas->size).h);
    (atlas->size).h = uVar1;
    dst = czmap_create((atlas->size).w,(atlas->size).h);
    czmap_copy(atlas->map,dst);
    czmap_destroy(atlas->map,(czdestroyfunc)0x0);
    atlas->map = dst;
    _atlas_local = chizu_internal_lease_or_enlarge(atlas,width,height,data);
  }
  return _atlas_local;
}

Assistant:

static czrect chizu_internal_lease_or_enlarge(chizu * atlas, unsigned width, unsigned height, void * data) {
    czrect resultrect;
    unsigned inc = 0;
    czmap * newmap = NULL;
    resultrect = czmap_lease(atlas->map, width, height, data);
    if (!czrect_is_empty(resultrect))
        return resultrect;

    /* find the largest size to expand map with */
    inc = width;
    if (width < height) inc = height;

    if (atlas->size.w > atlas->size.h)
        atlas->size.h += inc;
    else
        atlas->size.w += inc;

    atlas->size.w = chizu_internal_next_power_of_2(atlas->size.w);
    atlas->size.h = chizu_internal_next_power_of_2(atlas->size.h);

    /* create a new map and copy contents */
    newmap = czmap_create(atlas->size.w, atlas->size.h);
    czmap_copy(atlas->map, newmap);
    czmap_destroy(atlas->map, NULL);
    atlas->map = newmap;

    /* try again until space was found */
    return chizu_internal_lease_or_enlarge(atlas, width, height, data);
}